

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subcommands.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  App *pAVar1;
  App *this;
  ostream *poVar2;
  pointer ppAVar3;
  _Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_> local_3f8;
  allocator local_3e0 [32];
  string file;
  string local_3a0;
  string local_380;
  string local_360;
  string local_340;
  string local_320;
  string local_300;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  App app;
  
  std::__cxx11::string::string((string *)&local_220,"K3Pi goofit fitter",(allocator *)&file);
  CLI::App::App(&app,&local_220);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::string((string *)&local_240,"--random",(allocator *)&file);
  std::__cxx11::string::string((string *)&local_260,"Some random flag",local_3e0);
  CLI::App::add_flag(&app,&local_240,&local_260);
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::string((string *)&local_280,"start",(allocator *)&file);
  std::__cxx11::string::string((string *)&local_2a0,"A great subcommand",local_3e0);
  pAVar1 = CLI::App::add_subcommand(&app,&local_280,&local_2a0);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::string::string((string *)&local_2c0,"stop",(allocator *)&file);
  std::__cxx11::string::string((string *)&local_2e0,"Do you really want to stop?",local_3e0);
  this = CLI::App::add_subcommand(&app,&local_2c0,&local_2e0);
  std::__cxx11::string::~string((string *)&local_2e0);
  std::__cxx11::string::~string((string *)&local_2c0);
  file._M_dataplus._M_p = (pointer)&file.field_2;
  file._M_string_length = 0;
  file.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&local_300,"-f,--file",local_3e0);
  std::__cxx11::string::string((string *)&local_320,"File name",(allocator *)&local_3f8);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar1,&local_300,&file,&local_320);
  std::__cxx11::string::~string((string *)&local_320);
  std::__cxx11::string::~string((string *)&local_300);
  std::__cxx11::string::string((string *)&local_340,"-c,--count",local_3e0);
  std::__cxx11::string::string((string *)&local_360,"Counter",(allocator *)&local_3f8);
  CLI::App::add_flag(this,&local_340,&local_360);
  std::__cxx11::string::~string((string *)&local_360);
  std::__cxx11::string::~string((string *)&local_340);
  CLI::App::parse(&app,argc,argv);
  poVar2 = std::operator<<((ostream *)&std::cout,"Working on file: ");
  poVar2 = std::operator<<(poVar2,(string *)&file);
  poVar2 = std::operator<<(poVar2,", direct count: ");
  std::__cxx11::string::string((string *)&local_380,"--file",local_3e0);
  CLI::App::count(pAVar1,&local_380);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)&local_380);
  poVar2 = std::operator<<((ostream *)&std::cout,"Working on count: ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2,", direct count: ");
  std::__cxx11::string::string((string *)&local_3a0,"--count",local_3e0);
  CLI::App::count(this,&local_3a0);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)&local_3a0);
  CLI::App::get_subcommands((vector<CLI::App_*,_std::allocator<CLI::App_*>_> *)&local_3f8,&app,true)
  ;
  for (ppAVar3 = local_3f8._M_impl.super__Vector_impl_data._M_start;
      ppAVar3 != local_3f8._M_impl.super__Vector_impl_data._M_finish; ppAVar3 = ppAVar3 + 1) {
    pAVar1 = *ppAVar3;
    poVar2 = std::operator<<((ostream *)&std::cout,"Subcommand:");
    std::__cxx11::string::string((string *)local_3e0,(string *)&pAVar1->name_);
    poVar2 = std::operator<<(poVar2,(string *)local_3e0);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string((string *)local_3e0);
  }
  CLI::std::_Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>::~_Vector_base(&local_3f8);
  std::__cxx11::string::~string((string *)&file);
  CLI::App::~App(&app);
  return 0;
}

Assistant:

int main(int argc, char **argv) {

    CLI::App app("K3Pi goofit fitter");
    app.add_flag("--random", "Some random flag");
    CLI::App *start = app.add_subcommand("start", "A great subcommand");
    CLI::App *stop = app.add_subcommand("stop", "Do you really want to stop?");

    std::string file;
    start->add_option("-f,--file", file, "File name");

    CLI::Option *s = stop->add_flag("-c,--count", "Counter");

    CLI11_PARSE(app, argc, argv);

    std::cout << "Working on file: " << file << ", direct count: " << start->count("--file") << std::endl;
    std::cout << "Working on count: " << s->count() << ", direct count: " << stop->count("--count") << std::endl;
    for(auto subcom : app.get_subcommands())
        std::cout << "Subcommand:" << subcom->get_name() << std::endl;

    return 0;
}